

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_event_loop.cpp
# Opt level: O1

void __thiscall sock2::operator()(sock2 *this,error_code *e)

{
  int iVar1;
  undefined8 in_RAX;
  long *plVar2;
  ssize_t sVar3;
  char c;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  if (e->_M_value != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"!e",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
    plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x42);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    return_code = 1;
  }
  iVar1 = this->counter;
  this->counter = iVar1 + 1;
  uStack_18 = CONCAT17((char)iVar1,(undefined7)uStack_18);
  sVar3 = send(this->fd,(void *)((long)&uStack_18 + 7),1,0);
  if ((int)sVar3 != 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"n==1",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
    plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x45);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    return_code = 1;
  }
  if (this->counter == 10) {
    shutdown(this->fd,2);
  }
  else {
    async_run(this);
  }
  return;
}

Assistant:

void operator()(booster::system::error_code const &e)
	{
		TEST(!e);
		char c=counter++;
		int n = ::send(fd,&c,1,0);
		TEST(n==1);
		if(counter == 10) {
			#ifdef SHUT_RDWR
			shutdown(fd,SHUT_RDWR);
			#else
			shutdown(fd,SD_BOTH);
			#endif
		}
		else  {
			async_run();
		}

	}